

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O3

int32_t characterIteratorMove(UCharIterator *iter,int32_t delta,UCharIteratorOrigin origin)

{
  int32_t iVar1;
  undefined4 in_register_00000034;
  ulong uVar2;
  long *plVar3;
  
  uVar2 = CONCAT44(in_register_00000034,delta);
  if (origin < UITER_ZERO) {
    iVar1 = (**(code **)(*iter->context + 0xc0))();
    return iVar1;
  }
  if (origin == UITER_LENGTH) {
    plVar3 = (long *)iter->context;
    uVar2 = (ulong)(uint)(delta + (int)plVar3[1]);
  }
  else {
    if (origin != UITER_ZERO) {
      return -1;
    }
    plVar3 = (long *)iter->context;
  }
  (**(code **)(*plVar3 + 0x78))(plVar3,uVar2);
  return *(int32_t *)((long)iter->context + 0xc);
}

Assistant:

static int32_t U_CALLCONV
characterIteratorMove(UCharIterator *iter, int32_t delta, UCharIteratorOrigin origin) {
    switch(origin) {
    case UITER_ZERO:
        ((CharacterIterator *)(iter->context))->setIndex(delta);
        return ((CharacterIterator *)(iter->context))->getIndex();
    case UITER_START:
    case UITER_CURRENT:
    case UITER_LIMIT:
        return ((CharacterIterator *)(iter->context))->move(delta, (CharacterIterator::EOrigin)origin);
    case UITER_LENGTH:
        ((CharacterIterator *)(iter->context))->setIndex(((CharacterIterator *)(iter->context))->getLength()+delta);
        return ((CharacterIterator *)(iter->context))->getIndex();
    default:
        /* not a valid origin */
        /* Should never get here! */
        return -1;
    }
}